

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbd_standalone.cpp
# Opt level: O3

int __thiscall Intel_V4L2::capture_frame(Intel_V4L2 *this)

{
  int iVar1;
  ostream *poVar2;
  char *__s;
  
  usleep(100000);
  iVar1 = ioctl(this->m_fd,0xc058560f,this->m_pV4l2Buffer);
  if (iVar1 < 0) {
    __s = "Intel_V4L2::capture_frame : VIDIOC_QBUF : ";
  }
  else {
    usleep(100000);
    iVar1 = ioctl(this->m_fd,0xc0585611,this->m_pV4l2Buffer);
    if (-1 < iVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Intel_V4L2::capture_frame : received bytes [",0x2c);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      printf("Intel_V4L2::capture_frame : flags=[0x%08x]\n",(ulong)this->m_pV4l2Buffer->flags);
      this->m_frameCount = this->m_frameCount + 1;
      usleep(10000);
      return 0;
    }
    __s = "Intel_V4L2::capture_frame : VIDIOC_DQBUF : ";
  }
  perror(__s);
  return -1;
}

Assistant:

int Intel_V4L2::capture_frame () {

    usleep (100000);

    if (0 > ioctl (m_fd, VIDIOC_QBUF, m_pV4l2Buffer)) {
        perror ("Intel_V4L2::capture_frame : VIDIOC_QBUF : ");
        return -1;
    }

    usleep (100000);

    if (0 > ioctl (m_fd, VIDIOC_DQBUF, m_pV4l2Buffer)) {
        perror ("Intel_V4L2::capture_frame : VIDIOC_DQBUF : ");
        return -1;
    }

    std::cout << "Intel_V4L2::capture_frame : received bytes [" << m_pV4l2Buffer->bytesused << "]" << std::endl;
    printf ("Intel_V4L2::capture_frame : flags=[0x%08x]\n", m_pV4l2Buffer->flags);

    #ifdef STANDALONE_TEST
    if (m_frameCount % 10 == 0) {
      char buf[1024];
      sprintf (buf, "raw_data%02d.bin", m_frameCount);
      FILE *pFout = fopen (buf, "w");
      // size_t fwrite(const void *ptr, size_t size, size_t nmemb, FILE *stream);
      fwrite (m_pBigBuffer, m_pV4l2Buffer->bytesused, 1, pFout);
      fclose (pFout);
    }
    #endif
    m_frameCount++;
    usleep (10000);
    return 0;
}